

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

void __thiscall leveldb::BlockBuilder::BlockBuilder(BlockBuilder *this,Options *options)

{
  value_type_conflict1 local_1c;
  Options *local_18;
  Options *options_local;
  BlockBuilder *this_local;
  
  this->options_ = options;
  local_18 = options;
  options_local = (Options *)this;
  std::__cxx11::string::string((string *)&this->buffer_);
  memset(&this->restarts_,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->restarts_);
  this->counter_ = 0;
  this->finished_ = false;
  std::__cxx11::string::string((string *)&this->last_key_);
  if (0 < local_18->block_restart_interval) {
    local_1c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->restarts_,&local_1c);
    return;
  }
  __assert_fail("options->block_restart_interval >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/block_builder.cc"
                ,0x2a,"leveldb::BlockBuilder::BlockBuilder(const Options *)");
}

Assistant:

BlockBuilder::BlockBuilder(const Options* options)
    : options_(options), restarts_(), counter_(0), finished_(false) {
  assert(options->block_restart_interval >= 1);
  restarts_.push_back(0);  // First restart point is at offset 0
}